

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_socket.cpp
# Opt level: O3

int ConvertToIPAddress(char *szNameOrAddress,in_addr *Address)

{
  int iVar1;
  in_addr_t iVar2;
  hostent *phVar3;
  unsigned_long addr;
  ulong local_18;
  
  if ((szNameOrAddress == (char *)0x0) || (*szNameOrAddress == '\0')) {
    Address->s_addr = 0xffffffff;
  }
  else {
    iVar1 = isalpha((int)*szNameOrAddress);
    if (iVar1 == 0) {
      iVar2 = inet_addr(szNameOrAddress);
      local_18 = (ulong)iVar2;
      phVar3 = gethostbyaddr(&local_18,4,2);
      if (phVar3 == (hostent *)0x0) {
        return -1;
      }
    }
    else {
      phVar3 = gethostbyname(szNameOrAddress);
      if (phVar3 == (hostent *)0x0) {
        return -1;
      }
      if (phVar3->h_length != 4) {
        return -1;
      }
      local_18._0_4_ = *(in_addr_t *)*phVar3->h_addr_list;
    }
    Address->s_addr = (in_addr_t)local_18;
  }
  return 0;
}

Assistant:

int ConvertToIPAddress(const char *szNameOrAddress, struct in_addr *Address)
{
  struct hostent* haddr = NULL;
  //    char s[256];

  if (szNameOrAddress == NULL || szNameOrAddress[0] == 0) {
    Address->s_addr = INADDR_BROADCAST;
    return 0;
  }

  /* find Internet address of host */

  if (!isalpha(szNameOrAddress[0])) {
    /* Convert a.b.c.d address to a usable one */
    unsigned long addr = inet_addr(szNameOrAddress);
    haddr = gethostbyaddr((char *) &addr, 4, AF_INET);
    if (haddr != NULL) {
      Address->s_addr = addr;
      return 0;
    }
    return -1;
  }

  /* server address is a name */
  haddr = gethostbyname(szNameOrAddress);

  if (haddr == NULL) {
    return -1;
  }

  if (haddr->h_length != sizeof(in_addr)) {
    //        LOGMESSAGE("SOCKET ERROR: address sizes don't match?!");
    return -1;
  }

  memcpy(
      Address,
      haddr->h_addr_list[0],
      sizeof(in_addr));

  return 0;
}